

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3HashClear(Fts3Hash *pH)

{
  Fts3HashElem *pFVar1;
  Fts3HashElem *next_elem;
  Fts3HashElem *elem;
  Fts3Hash *pH_local;
  
  next_elem = pH->first;
  pH->first = (Fts3HashElem *)0x0;
  fts3HashFree(pH->ht);
  pH->ht = (_fts3ht *)0x0;
  pH->htsize = 0;
  while (next_elem != (Fts3HashElem *)0x0) {
    pFVar1 = next_elem->next;
    if ((pH->copyKey != '\0') && (next_elem->pKey != (void *)0x0)) {
      fts3HashFree(next_elem->pKey);
    }
    fts3HashFree(next_elem);
    next_elem = pFVar1;
  }
  pH->count = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3HashClear(Fts3Hash *pH){
  Fts3HashElem *elem;         /* For looping over all elements of the table */

  assert( pH!=0 );
  elem = pH->first;
  pH->first = 0;
  fts3HashFree(pH->ht);
  pH->ht = 0;
  pH->htsize = 0;
  while( elem ){
    Fts3HashElem *next_elem = elem->next;
    if( pH->copyKey && elem->pKey ){
      fts3HashFree(elem->pKey);
    }
    fts3HashFree(elem);
    elem = next_elem;
  }
  pH->count = 0;
}